

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_NtkMatch(Ifn_Ntk_t *p,word *pTruth,int nVars,int nConfls,int fVerbose,int fVeryVerbose,
                word *pConfig)

{
  word *pwVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  sat_solver *s;
  ulong *puVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  int *pValues;
  uint uVar15;
  bool bVar16;
  timespec ts;
  int local_74;
  timespec local_68;
  long local_58;
  uint local_50;
  int local_4c;
  word *local_48;
  int *local_40;
  long local_38;
  
  local_74 = 1;
  uVar5 = 1 << ((byte)nVars & 0x1f);
  local_48 = pTruth;
  iVar6 = clock_gettime(3,&local_68);
  if (iVar6 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  if (nVars != 0) {
    s = sat_solver_new();
    Ifn_Prepare(p,local_48,nVars);
    sat_solver_setnvars(s,p->nPars);
    Ifn_NtkAddConstraints(p,s);
    if (fVeryVerbose != 0) {
      iVar6 = clock_gettime(3,&local_68);
      if (iVar6 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Ifn_NtkMatchPrintStatus(s,0,1,-1,-1,lVar12 - local_58);
    }
    if ((pConfig != (word *)0x0) && (*pConfig != 0)) {
      __assert_fail("*pConfig == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTune.c"
                    ,0x541,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
    }
    uVar15 = 0;
    bVar4 = true;
    bVar3 = nVars != 0x1f;
    if (nVars == 0x1f) {
      local_74 = 0;
    }
    else {
      pValues = p->Values;
      local_38 = (long)nConfls;
      local_50 = 1;
      if (1 < (int)uVar5) {
        local_50 = uVar5;
      }
      uVar11 = 0;
      uVar15 = 0;
      local_40 = pValues;
      do {
        lVar12 = (long)p->nObjs;
        uVar13 = (uint)uVar11;
        if (0 < lVar12) {
          iVar6 = p->nVars;
          lVar10 = 0;
          do {
            uVar9 = (uint)((uVar13 >> ((uint)lVar10 & 0x1f) & 1) != 0);
            if (iVar6 <= lVar10) {
              uVar9 = 0xffffffff;
            }
            p->Values[lVar10] = uVar9;
            lVar10 = lVar10 + 1;
          } while (lVar12 != lVar10);
        }
        p->Values[lVar12 + -1] = (uint)((local_48[(int)uVar13 >> 6] >> (uVar11 & 0x3f) & 1) != 0);
        iVar6 = Ifn_NtkAddClauses(p,pValues,s);
        local_74 = 0;
        if (iVar6 == 0) break;
        iVar6 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,local_38,0,0,0);
        if (fVeryVerbose != 0) {
          local_4c = p->Values[(long)p->nObjs + -1];
          iVar7 = clock_gettime(3,&local_68);
          if (iVar7 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
          }
          Ifn_NtkMatchPrintStatus(s,uVar15 + 1,iVar6,uVar13,local_4c,lVar12 - local_58);
        }
        pValues = local_40;
        if (iVar6 != 1) break;
        uVar13 = p->nObjs;
        uVar11 = (ulong)uVar13;
        iVar6 = p->nPars;
        uVar9 = uVar13;
        while ((int)uVar9 < iVar6) {
          if (((int)uVar13 < 0) || (s->size <= (int)uVar11)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          p->Values[uVar11] = (uint)(s->model[uVar11] == 1);
          uVar11 = uVar11 + 1;
          uVar9 = (uint)uVar11;
        }
        puVar8 = Ifn_NtkDeriveTruth(p,local_40);
        iVar6 = p->nWords;
        if (0 < (long)iVar6) {
          pwVar1 = p->pTruth;
          lVar12 = 0;
          do {
            puVar8[lVar12] = puVar8[lVar12] ^ pwVar1[lVar12];
            lVar12 = lVar12 + 1;
          } while (iVar6 != lVar12);
        }
        uVar13 = 1 << ((char)p->nVars - 6U & 0x1f);
        if (p->nVars < 7) {
          uVar13 = 1;
        }
        uVar11 = 0xffffffff;
        if (0 < (int)uVar13) {
          lVar12 = 0;
          do {
            uVar2 = *puVar8;
            if (uVar2 != 0) {
              bVar16 = (int)uVar2 == 0;
              uVar11 = uVar2 >> 0x20;
              if (!bVar16) {
                uVar11 = uVar2;
              }
              iVar7 = (uint)bVar16 * 0x20;
              iVar6 = iVar7 + 0x10;
              uVar2 = uVar11 >> 0x10;
              if ((short)uVar11 != 0) {
                iVar6 = iVar7;
                uVar2 = uVar11;
              }
              iVar7 = iVar6 + 8;
              uVar11 = uVar2 >> 8;
              if ((char)uVar2 != '\0') {
                iVar7 = iVar6;
                uVar11 = uVar2;
              }
              iVar6 = iVar7 + 4;
              uVar2 = uVar11 >> 4;
              if ((uVar11 & 0xf) != 0) {
                iVar6 = iVar7;
                uVar2 = uVar11;
              }
              uVar13 = (uint)(uVar2 >> 2) & 0x3fffffff;
              iVar7 = iVar6 + 2;
              if ((uVar2 & 3) != 0) {
                uVar13 = (uint)uVar2;
                iVar7 = iVar6;
              }
              uVar11 = (ulong)(((~uVar13 & 1) + iVar7) - (int)lVar12);
              break;
            }
            lVar12 = lVar12 + -0x40;
            puVar8 = puVar8 + 1;
          } while ((ulong)uVar13 * 0x40 + lVar12 != 0);
        }
        if ((int)uVar11 == -1) {
          local_74 = 1;
          if (pConfig != (word *)0x0) {
            Ifn_NtkMatchCollectConfig(p,s,pConfig);
          }
          bVar4 = false;
          break;
        }
        uVar15 = uVar15 + 1;
        bVar3 = (int)uVar15 < (int)uVar5;
      } while (uVar15 != local_50);
    }
    if (!bVar3) {
      __assert_fail("i < nIterMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTune.c"
                    ,0x56e,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
    }
    if (fVerbose != 0) {
      pcVar14 = "yes";
      if (bVar4) {
        pcVar14 = "no ";
      }
      uVar5 = sat_solver_nconflicts(s);
      printf("%s  Iter =%4d. Confl = %6d.  ",pcVar14,(ulong)uVar15,(ulong)uVar5);
      if (!bVar4) {
        Ifn_NtkMatchPrintConfig(p,s);
      }
      putchar(10);
    }
    sat_solver_delete(s);
  }
  return local_74;
}

Assistant:

int Ifn_NtkMatch( Ifn_Ntk_t * p, word * pTruth, int nVars, int nConfls, int fVerbose, int fVeryVerbose, word * pConfig )
{
    word * pTruth1;
    int RetValue = 0;
    int nIterMax = (1<<nVars);
    int i, v, status, iMint = 0;
    abctime clk = Abc_Clock();
//    abctime clkTru = 0, clkSat = 0, clk2;
    sat_solver * pSat;
    if ( nVars == 0 )
        return 1;
    pSat = sat_solver_new();
    Ifn_Prepare( p, pTruth, nVars );
    sat_solver_setnvars( pSat, p->nPars );
    Ifn_NtkAddConstraints( p, pSat );
    if ( fVeryVerbose )
        Ifn_NtkMatchPrintStatus( pSat, 0, l_True, -1, -1, Abc_Clock() - clk );
    if ( pConfig ) assert( *pConfig == 0 );
    for ( i = 0; i < nIterMax; i++ )
    {
        // get variable assignment
        for ( v = 0; v < p->nObjs; v++ )
            p->Values[v] = v < p->nVars ? (iMint >> v) & 1 :  -1;
        p->Values[p->nObjs-1] = Abc_TtGetBit( pTruth, iMint );
        // derive clauses
        if ( !Ifn_NtkAddClauses( p, p->Values, pSat ) )
            break;
        // find assignment of parameters
//        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, nConfls, 0, 0, 0 );
//        clkSat += Abc_Clock() - clk2;
        if ( fVeryVerbose )
            Ifn_NtkMatchPrintStatus( pSat, i+1, status, iMint, p->Values[p->nObjs-1], Abc_Clock() - clk );
        if ( status != l_True )
            break;
        // collect assignment
        for ( v = p->nObjs; v < p->nPars; v++ )
            p->Values[v] = sat_solver_var_value(pSat, v);
        // find truth table
//        clk2 = Abc_Clock();
        pTruth1 = Ifn_NtkDeriveTruth( p, p->Values );
//        clkTru += Abc_Clock() - clk2;
        Abc_TtXor( pTruth1, pTruth1, p->pTruth, p->nWords, 0 );
        // find mismatch if present
        iMint = Abc_TtFindFirstBit( pTruth1, p->nVars );
        if ( iMint == -1 )
        {
            if ( pConfig ) 
                Ifn_NtkMatchCollectConfig( p, pSat, pConfig );
/*
            if ( pPerm )
            {
                int RetValue = Ifn_ManSatFindCofigBitsTest( p, pTruth, nVars, *pPerm );
                Ifn_NtkMatchPrintPerm( *pPerm, p->nInps );
                if ( RetValue == 0 )
                    printf( "Verification failed.\n" );
            }
*/
            RetValue = 1;
            break;
        }
    }
    assert( i < nIterMax );
    if ( fVerbose )
    {
        printf( "%s  Iter =%4d. Confl = %6d.  ", RetValue ? "yes":"no ", i, sat_solver_nconflicts(pSat) );
        if ( RetValue )
            Ifn_NtkMatchPrintConfig( p, pSat );
        printf( "\n" );
    }
    sat_solver_delete( pSat );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Sat", clkSat );
//    Abc_PrintTime( 1, "Tru", clkTru );
    return RetValue;
}